

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O1

void libtorrent::rc4_init(uchar *in,size_t len,rc4 *state)

{
  uchar uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  byte bVar7;
  long lVar8;
  array<std::uint8_t,_key_size> key;
  char local_108 [256];
  
  state->x = 0;
  if (len != 0) {
    sVar3 = 0x100;
    if (len < 0x100) {
      sVar3 = len;
    }
    sVar4 = 0;
    do {
      uVar1 = in[sVar4];
      iVar2 = state->x;
      state->x = iVar2 + 1;
      (state->buf).super_array<unsigned_char,_256UL>._M_elems[iVar2] = uVar1;
      sVar4 = sVar4 + 1;
    } while (sVar3 != sVar4);
  }
  memcpy(local_108,&state->buf,0x100);
  iVar2 = state->x;
  lVar5 = 0;
  do {
    (state->buf).super_array<unsigned_char,_256UL>._M_elems[lVar5] = (uchar)lVar5;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  lVar5 = 8;
  iVar6 = 0;
  bVar7 = 0;
  do {
    uVar1 = (state->buf).super_array<unsigned_char,_256UL>._M_elems[lVar5 + -8];
    lVar8 = (long)iVar6;
    iVar6 = iVar6 + 1;
    bVar7 = bVar7 + uVar1 + local_108[lVar8];
    if (iVar6 == iVar2) {
      iVar6 = 0;
    }
    (state->buf).super_array<unsigned_char,_256UL>._M_elems[lVar5 + -8] =
         (state->buf).super_array<unsigned_char,_256UL>._M_elems[bVar7];
    (state->buf).super_array<unsigned_char,_256UL>._M_elems[bVar7] = uVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x108);
  state->x = 0;
  state->y = 0;
  return;
}

Assistant:

void rc4_init(const unsigned char* in, std::size_t len, rc4 *state)
{
	std::size_t const key_size = sizeof(state->buf);
	aux::array<std::uint8_t, key_size> key;
	std::uint8_t tmp, *s;
	int keylen, x, y, j;

	TORRENT_ASSERT(state != nullptr);
	TORRENT_ASSERT(len <= key_size);
	if (len > key_size) len = key_size;

	state->x = 0;
	while (len--) {
		state->buf[state->x++] = *in++;
	}

	/* extract the key */
	s = state->buf.data();
	std::memcpy(key.data(), s, key_size);
	keylen = state->x;

	/* make RC4 perm and shuffle */
	for (x = 0; x < int(key_size); ++x) {
		s[x] = x & 0xff;
	}

	for (j = x = y = 0; x < int(key_size); x++) {
		y = (y + state->buf[x] + key[j++]) & 255;
		if (j == keylen) {
			j = 0;
		}
		tmp = s[x]; s[x] = s[y]; s[y] = tmp;
	}
	state->x = 0;
	state->y = 0;
}